

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3ReadEndBlockField(sqlite3_stmt *pStmt,int iCol,i64 *piEndBlock,i64 *pnByte)

{
  uchar *puVar1;
  byte *pbVar2;
  long lVar3;
  long lVar4;
  long lStack_20;
  
  puVar1 = sqlite3_column_text(pStmt,iCol);
  if (puVar1 != (uchar *)0x0) {
    lVar4 = 0;
    for (lVar3 = 0; (byte)(puVar1[lVar3] - 0x30) < 10; lVar3 = lVar3 + 1) {
      lVar4 = (ulong)(puVar1[lVar3] & 0xf) + lVar4 * 10;
    }
    *piEndBlock = lVar4;
    for (; puVar1[lVar3] == ' '; lVar3 = lVar3 + 1) {
    }
    if (puVar1[lVar3] == '-') {
      lVar3 = lVar3 + 1;
      lStack_20 = -1;
    }
    else {
      lStack_20 = 1;
    }
    lVar4 = 0;
    for (pbVar2 = puVar1 + (int)lVar3; (byte)(*pbVar2 - 0x30) < 10; pbVar2 = pbVar2 + 1) {
      lVar4 = (ulong)(*pbVar2 & 0xf) + lVar4 * 10;
    }
    *pnByte = lVar4 * lStack_20;
  }
  return;
}

Assistant:

static void fts3ReadEndBlockField(
  sqlite3_stmt *pStmt,
  int iCol,
  i64 *piEndBlock,
  i64 *pnByte
){
  const unsigned char *zText = sqlite3_column_text(pStmt, iCol);
  if( zText ){
    int i;
    int iMul = 1;
    u64 iVal = 0;
    for(i=0; zText[i]>='0' && zText[i]<='9'; i++){
      iVal = iVal*10 + (zText[i] - '0');
    }
    *piEndBlock = (i64)iVal;
    while( zText[i]==' ' ) i++;
    iVal = 0;
    if( zText[i]=='-' ){
      i++;
      iMul = -1;
    }
    for(/* no-op */; zText[i]>='0' && zText[i]<='9'; i++){
      iVal = iVal*10 + (zText[i] - '0');
    }
    *pnByte = ((i64)iVal * (i64)iMul);
  }
}